

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiContext * ImGui::CreateContext(_func_void_ptr_size_t *malloc_fn,_func_void_void_ptr *free_fn)

{
  ImGuiContext *pIVar1;
  ImGuiContext *this;
  _func_void_void_ptr *local_58;
  ImGuiContext *ctx;
  _func_void_void_ptr *free_fn_local;
  _func_void_ptr_size_t *malloc_fn_local;
  
  free_fn_local = (_func_void_void_ptr *)malloc_fn;
  if (malloc_fn == (_func_void_ptr_size_t *)0x0) {
    free_fn_local = malloc;
  }
  pIVar1 = (ImGuiContext *)(*free_fn_local)((void *)0x3aa0);
  this = (ImGuiContext *)operator_new(0x3aa0);
  ImGuiContext::ImGuiContext(this);
  (pIVar1->IO).MemAllocFn = (_func_void_ptr_size_t *)free_fn_local;
  local_58 = free_fn;
  if (free_fn == (_func_void_void_ptr *)0x0) {
    local_58 = free;
  }
  (pIVar1->IO).MemFreeFn = local_58;
  return pIVar1;
}

Assistant:

ImGuiContext* ImGui::CreateContext(void* (*malloc_fn)(size_t), void (*free_fn)(void*))
{
    if (!malloc_fn) malloc_fn = malloc;
    ImGuiContext* ctx = (ImGuiContext*)malloc_fn(sizeof(ImGuiContext));
    IM_PLACEMENT_NEW(ctx) ImGuiContext();
    ctx->IO.MemAllocFn = malloc_fn;
    ctx->IO.MemFreeFn = free_fn ? free_fn : free;
    return ctx;
}